

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O3

void __thiscall
CRegexStack::swap(CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
                 re_state_id *final,re_group_register_conflict *regs,short *loop_vars)

{
  short sVar1;
  int iVar2;
  int iVar3;
  re_state_id rVar4;
  char *pcVar5;
  re_group_register_conflict rVar6;
  size_t sVar7;
  int *piVar8;
  long lVar9;
  
  pcVar5 = this->buf_;
  iVar2 = this->sp_;
  iVar3 = *str_ofs;
  piVar8 = (int *)(pcVar5 + (long)iVar2 + 0x24);
  *str_ofs = *(int *)(pcVar5 + (long)iVar2 + 8);
  *(int *)(pcVar5 + (long)iVar2 + 8) = iVar3;
  iVar3 = *start_ofs;
  *start_ofs = *(int *)(pcVar5 + (long)iVar2 + 4);
  *(int *)(pcVar5 + (long)iVar2 + 4) = iVar3;
  sVar7 = *curlen;
  *curlen = (long)*(int *)(pcVar5 + (long)iVar2 + 0xc);
  *(int *)(pcVar5 + (long)iVar2 + 0xc) = (int)sVar7;
  rVar4 = *state;
  *state = *(re_state_id *)(pcVar5 + (long)iVar2 + 0x10);
  *(re_state_id *)(pcVar5 + (long)iVar2 + 0x10) = rVar4;
  rVar4 = *final;
  *final = *(re_state_id *)(pcVar5 + (long)iVar2 + 0x14);
  *(re_state_id *)(pcVar5 + (long)iVar2 + 0x14) = rVar4;
  if (piVar8 < this->buf_ + this->used_) {
    do {
      lVar9 = (long)*piVar8;
      if (lVar9 < 10) {
        rVar6 = regs[lVar9];
        regs[lVar9] = *(re_group_register_conflict *)(piVar8 + 1);
        *(re_group_register_conflict *)(piVar8 + 1) = rVar6;
      }
      else {
        sVar1 = loop_vars[lVar9 + -10];
        loop_vars[lVar9 + -10] = (short)piVar8[1];
        *(short *)(piVar8 + 1) = sVar1;
      }
      piVar8 = piVar8 + 3;
    } while (piVar8 < this->buf_ + this->used_);
  }
  return;
}

Assistant:

void swap(int *start_ofs, int *str_ofs, size_t *curlen,
              re_state_id *state, re_state_id *final,
              re_group_register *regs, short *loop_vars)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* swap the string offset */
        int tmp_ofs = *str_ofs;
        *str_ofs = fp->str_ofs;
        fp->str_ofs = tmp_ofs;

        /* swap the starting offset */
        tmp_ofs = *start_ofs;
        *start_ofs = fp->start_ofs;
        fp->start_ofs = tmp_ofs;

        /* swap the search length */
        size_t tmp_len = *curlen;
        *curlen = fp->curlen;
        fp->curlen = tmp_len;

        /* swap the current machine state */
        re_state_id tmp_id = *state;
        *state = fp->state;
        fp->state = tmp_id;

        /* swap the final machine state */
        tmp_id = *final;
        *final = fp->final;
        fp->final = tmp_id;

        /* swap all group and loop registers with the current state */
        for (regex_stack_var *var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* sense the type */
            if (var->id < RE_GROUP_REG_CNT)
            {
                re_group_register tmp;
                
                /* it's a group register */
                tmp = regs[var->id];
                regs[var->id] = var->val.group;
                var->val.group = tmp;
            }
            else
            {
                short tmp;
                
                /* it's a loop variable */
                tmp = loop_vars[var->id - RE_GROUP_REG_CNT];
                loop_vars[var->id - RE_GROUP_REG_CNT] = var->val.loopvar;
                var->val.loopvar = tmp;
            }
        }
    }